

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setPrimalBounds(SPxSolverBase<double> *this)

{
  Representation RVar1;
  SPxSolverBase<double> *in_RDI;
  VectorBase<double> *in_stack_ffffffffffffffd8;
  double *in_stack_ffffffffffffffe8;
  VectorBase<double> *this_00;
  
  SPxLPBase<double>::upper((SPxLPBase<double> *)0x2481c8);
  VectorBase<double>::operator=((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
  SPxLPBase<double>::lower((SPxLPBase<double> *)0x2481e6);
  VectorBase<double>::operator=((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
  RVar1 = rep(in_RDI);
  if (RVar1 == ROW) {
    SPxLPBase<double>::rhs((SPxLPBase<double> *)0x248213);
    VectorBase<double>::operator=((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
    SPxLPBase<double>::lhs((SPxLPBase<double> *)0x248231);
    VectorBase<double>::operator=((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    SPxLPBase<double>::lhs((SPxLPBase<double> *)0x248254);
    VectorBase<double>::operator=((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
    SPxLPBase<double>::rhs((SPxLPBase<double> *)0x248272);
    VectorBase<double>::operator=((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
    this_00 = (VectorBase<double> *)0xbff0000000000000;
    VectorBase<double>::operator*=
              ((VectorBase<double> *)0xbff0000000000000,in_stack_ffffffffffffffe8);
    VectorBase<double>::operator*=(this_00,(double *)0xbff0000000000000);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setPrimalBounds()
{

   theUCbound = SPxLPBase<R>::upper();
   theLCbound = SPxLPBase<R>::lower();

   if(rep() == ROW)
   {
      theURbound = this->rhs();
      theLRbound = this->lhs();
   }
   else
   {
      theURbound = this->lhs();
      theLRbound = this->rhs();
      theURbound *= -1.0;
      theLRbound *= -1.0;
   }
}